

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseModuleTypesCtx::addTag
          (Result<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *this,Name param_1,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *param_2,ImportNames *param_3,TypeUse *use
          ,Index pos)

{
  bool bVar1;
  pointer pTVar2;
  Ok local_95 [20];
  allocator<char> local_81;
  string local_80;
  Err local_60;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *local_40;
  value_type *t;
  ImportNames *param_3_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *param_2_local;
  ParseModuleTypesCtx *this_local;
  Name param_1_local;
  
  param_1_local.super_IString.str._M_len = param_1.super_IString.str._M_str;
  this_local = param_1.super_IString.str._M_len;
  t = (value_type *)param_3;
  param_3_local = (ImportNames *)param_2;
  param_2_local = (vector<wasm::Name,_std::allocator<wasm::Name>_> *)this;
  param_1_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  local_40 = std::
             vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
             ::operator[](&this->wasm->tags,(ulong)this->index);
  bVar1 = HeapType::isSignature(&use->type);
  if (bVar1) {
    pTVar2 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(local_40);
    (pTVar2->type).id = (use->type).id;
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,local_95);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"tag type must be a signature",&local_81);
    Lexer::err(&local_60,&this->in,(ulong)pos,&local_80);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_60);
    wasm::Err::~Err(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<>
  addTag(Name, const std::vector<Name>&, ImportNames*, TypeUse use, Index pos) {
    auto& t = wasm.tags[index];
    if (!use.type.isSignature()) {
      return in.err(pos, "tag type must be a signature");
    }
    t->type = use.type;
    return Ok{};
  }